

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O2

void correctResiduals(HighsLpSolverObject *solver_object)

{
  double dVar1;
  HighsOptions *pHVar2;
  HighsLp *pHVar3;
  HighsSolution *pHVar4;
  pointer pdVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  vector<double,_std::allocator<double>_> check_col_dual;
  vector<double,_std::allocator<double>_> check_row_value;
  
  pHVar2 = solver_object->options_;
  pHVar3 = solver_object->lp_;
  pHVar4 = solver_object->solution_;
  check_row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  check_col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  check_row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  check_row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  check_col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  check_col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  HighsSparseMatrix::productQuad(&pHVar3->a_matrix_,&check_row_value,&pHVar4->col_value,-2);
  if (pHVar4->dual_valid == true) {
    HighsSparseMatrix::productTransposeQuad(&pHVar3->a_matrix_,&check_col_dual,&pHVar4->row_dual,-2)
    ;
    uVar8 = 0;
    uVar6 = (ulong)(uint)pHVar3->num_col_;
    if (pHVar3->num_col_ < 1) {
      uVar6 = uVar8;
    }
    for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      check_col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8] =
           check_col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8] -
           (pHVar3->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8];
    }
  }
  dVar11 = (pHVar2->super_HighsOptionsStruct).primal_residual_tolerance;
  dVar1 = (pHVar2->super_HighsOptionsStruct).dual_residual_tolerance;
  uVar8 = 0;
  uVar6 = (ulong)(uint)pHVar3->num_row_;
  if (pHVar3->num_row_ < 1) {
    uVar6 = uVar8;
  }
  dVar12 = 0.0;
  dVar10 = 0.0;
  dVar13 = 0.0;
  iVar7 = 0;
  for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    pdVar5 = (pHVar4->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar15 = pdVar5[uVar8];
    dVar16 = check_row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8] - dVar15;
    dVar14 = ABS(dVar16);
    if (dVar11 < dVar14) {
      pdVar5[uVar8] = dVar15 + dVar16;
      iVar7 = iVar7 + 1;
      if (dVar12 <= dVar14) {
        dVar12 = dVar14;
      }
      dVar13 = dVar13 + dVar14;
    }
    if (dVar10 <= dVar14) {
      dVar10 = dVar14;
    }
  }
  if (pHVar4->dual_valid == true) {
    uVar8 = 0;
    uVar6 = (ulong)(uint)pHVar3->num_col_;
    if (pHVar3->num_col_ < 1) {
      uVar6 = uVar8;
    }
    dVar11 = 0.0;
    dVar15 = 0.0;
    iVar9 = 0;
    dVar14 = 0.0;
    for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      pdVar5 = (pHVar4->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar16 = pdVar5[uVar8];
      dVar18 = check_col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8] + dVar16;
      dVar17 = ABS(dVar18);
      if (dVar1 < dVar17) {
        pdVar5[uVar8] = dVar16 - dVar18;
        iVar9 = iVar9 + 1;
        if (dVar15 <= dVar17) {
          dVar15 = dVar17;
        }
        dVar14 = dVar14 + dVar17;
      }
      if (dVar11 <= dVar17) {
        dVar11 = dVar17;
      }
    }
  }
  else {
    iVar9 = 0;
    dVar11 = 0.0;
    dVar15 = 0.0;
    dVar14 = 0.0;
  }
  if (0 < iVar9 || 0 < iVar7) {
    highsLogUser(&(pHVar2->super_HighsOptionsStruct).log_options,kWarning,
                 "LP solver residuals: primal = %g; dual = %g yield num/max/sum primal (%d/%g/%g) and dual (%d/%g/%g) corrections\n"
                 ,dVar10,dVar11,dVar12,dVar13,dVar15,dVar14);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&check_col_dual.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&check_row_value.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void correctResiduals(HighsLpSolverObject& solver_object) {
  HighsOptions& options = solver_object.options_;
  HighsSolution& solution = solver_object.solution_;
  const bool& have_primal_solution = solution.value_valid;
  const bool& have_dual_solution = solution.dual_valid;
  assert(have_primal_solution);
  assert(have_dual_solution);
  HighsLp& lp = solver_object.lp_;
  std::vector<double> check_row_value;
  std::vector<double> check_col_dual;
  lp.a_matrix_.productQuad(check_row_value, solution.col_value);
  if (have_dual_solution) {
    lp.a_matrix_.productTransposeQuad(check_col_dual, solution.row_dual);
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
      check_col_dual[iCol] -= lp.col_cost_[iCol];
  }
  double norm_primal_residual = 0;
  HighsInt num_primal_correction = 0;
  double max_primal_correction = 0;
  double sum_primal_correction = 0;
  double use_primal_residual_tolerance = options.primal_residual_tolerance;

  double norm_dual_residual = 0;
  HighsInt num_dual_correction = 0;
  double max_dual_correction = 0;
  double sum_dual_correction = 0;
  double use_dual_residual_tolerance = options.dual_residual_tolerance;

  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    double primal_residual = check_row_value[iRow] - solution.row_value[iRow];
    double abs_primal_residual = std::fabs(primal_residual);
    if (abs_primal_residual > use_primal_residual_tolerance) {
      solution.row_value[iRow] += primal_residual;
      double check_primal_residual =
          std::fabs(check_row_value[iRow] - solution.row_value[iRow]);
      assert(check_primal_residual < 1e-10);
      num_primal_correction++;
      max_primal_correction =
          std::max(abs_primal_residual, max_primal_correction);
      sum_primal_correction += abs_primal_residual;
    }
    norm_primal_residual = std::max(abs_primal_residual, norm_primal_residual);
  }
  if (have_dual_solution) {
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      double dual_residual = check_col_dual[iCol] + solution.col_dual[iCol];
      double abs_dual_residual = std::fabs(dual_residual);
      if (abs_dual_residual > use_dual_residual_tolerance) {
        solution.col_dual[iCol] -= dual_residual;
        num_dual_correction++;
        max_dual_correction = std::max(abs_dual_residual, max_dual_correction);
        sum_dual_correction += abs_dual_residual;
      }
      norm_dual_residual = std::max(abs_dual_residual, norm_dual_residual);
    }
  }

  if (num_primal_correction > 0 || num_dual_correction > 0)
    highsLogUser(
        options.log_options, HighsLogType::kWarning,
        "LP solver residuals: primal = %g; dual = %g yield num/max/sum primal "
        "(%d/%g/%g) and dual (%d/%g/%g) corrections\n",
        norm_primal_residual, norm_dual_residual, int(num_primal_correction),
        max_primal_correction, sum_primal_correction, int(num_dual_correction),
        max_dual_correction, sum_dual_correction);
}